

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbeddedFunctions.cpp
# Opt level: O0

bool Refal2::embeddedProut(CExecutionContext *executionContext)

{
  shared_ptr<Refal2::CProgram> local_40;
  CProgramPrintHelper local_30;
  CExecutionContext *local_10;
  CExecutionContext *executionContext_local;
  
  local_10 = executionContext;
  std::shared_ptr<Refal2::CProgram>::shared_ptr(&local_40,&executionContext->Program);
  CProgramPrintHelper::CProgramPrintHelper(&local_30,&local_40);
  CUnitList::StrangePrint
            (&executionContext->Argument,(ostream *)&std::cout,&local_30.super_CPrintHelper);
  CProgramPrintHelper::~CProgramPrintHelper(&local_30);
  std::shared_ptr<Refal2::CProgram>::~shared_ptr(&local_40);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  CNodeList<Refal2::CUnit>::Empty((CNodeList<Refal2::CUnit> *)local_10);
  return true;
}

Assistant:

static bool embeddedProut( CExecutionContext& executionContext )
{
	DEBUG_PRINT( __FUNCTION__ )
	executionContext.Argument.StrangePrint( std::cout,
		CProgramPrintHelper( executionContext.Program ) );
	std::cout << std::endl;
	executionContext.Argument.Empty();
	return true;
}